

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O2

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::jsonpointer::
safe_unflatten<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
          (jsonpointer *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *value
          )

{
  bool bVar1;
  bool bVar2;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this_00;
  bool bVar3;
  size_t n_00;
  iterator value_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *item;
  __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  _Var5;
  byte bVar6;
  long lVar7;
  __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  _Var8;
  type tVar9;
  array_range_type aVar10;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar11;
  size_t n;
  object_range_type local_90;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *local_70;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  local_68;
  string_view_type local_50;
  jsonpointer local_40 [16];
  
  bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object(value);
  if ((!bVar3) ||
     (bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::empty(value), bVar3)
     ) {
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,value);
    uVar4 = extraout_RDX;
  }
  else {
    local_70 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)value;
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
              (&local_90,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)value);
    bVar2 = local_90.last_.has_value_;
    _Var8._M_current = local_90.last_.it_._M_current;
    bVar3 = local_90.first_.has_value_;
    bVar6 = local_90.first_.has_value_ & local_90.last_.has_value_;
    lVar7 = 0;
    _Var5._M_current = local_90.first_.it_._M_current;
    while( true ) {
      bVar1 = bVar3 == bVar2;
      if ((bVar6 & 1) != 0) {
        bVar1 = _Var5._M_current == _Var8._M_current;
      }
      if (bVar1) {
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&local_68,
                   &local_90);
        this_00 = local_70;
        n_00 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                         ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                          local_70);
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::reserve
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   &local_68.common_,n_00);
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
                  (&local_90,this_00);
        _Var8._M_current = local_90.first_.it_._M_current;
        while( true ) {
          bVar3 = local_90.first_.has_value_ == local_90.last_.has_value_;
          if ((local_90.first_.has_value_ & local_90.last_.has_value_ & 1U) != 0) {
            bVar3 = _Var8._M_current == local_90.last_.it_._M_current;
          }
          if (bVar3) break;
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
          emplace_back<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    ((basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
                     &local_68.common_,&(_Var8._M_current)->value_);
          _Var8._M_current = _Var8._M_current + 1;
        }
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                   &local_90);
        aVar10 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                           ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            &local_68.common_);
        for (value_00 = aVar10.first_._M_current;
            value_00._M_current != aVar10.last_._M_current._M_current;
            value_00._M_current = value_00._M_current + 1) {
          safe_unflatten<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    ((jsonpointer *)&local_90,value_00._M_current);
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
          emplace_back<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    ((basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)this,
                     (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&local_90);
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&local_90);
        }
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   &local_68.common_);
        uVar4 = extraout_RDX_02;
        goto LAB_00380547;
      }
      tVar9 = jsoncons::detail::dec_to_integer<unsigned_long,char>
                        (((_Var5._M_current)->key_)._M_dataplus._M_p,
                         ((_Var5._M_current)->key_)._M_string_length,(unsigned_long *)&local_68);
      if ((tVar9.ec != success) || (lVar7 != local_68._0_8_)) break;
      lVar7 = lVar7 + 1;
      _Var5._M_current = _Var5._M_current + 1;
    }
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,&local_90);
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
              (&local_90,local_70);
    uVar4 = extraout_RDX_00;
    while( true ) {
      bVar3 = local_90.first_.has_value_ == local_90.last_.has_value_;
      if ((local_90.first_.has_value_ & local_90.last_.has_value_ & 1U) != 0) {
        bVar3 = local_90.first_.it_._M_current == local_90.last_.it_._M_current;
      }
      if (bVar3) break;
      local_50._M_str = ((local_90.first_.it_._M_current)->key_)._M_dataplus._M_p;
      local_50._M_len = ((local_90.first_.it_._M_current)->key_)._M_string_length;
      safe_unflatten<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                (local_40,&(local_90.first_.it_._M_current)->value_);
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
      try_emplace<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                  *)&local_68.common_,
                 (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)this,&local_50,
                 (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_40);
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_40);
      local_90.first_.it_._M_current = local_90.first_.it_._M_current + 1;
      uVar4 = extraout_RDX_01;
    }
  }
LAB_00380547:
  bVar11.field_0.int64_.val_ = uVar4;
  bVar11.field_0._0_8_ = this;
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar11.field_0;
}

Assistant:

Json safe_unflatten (Json& value)
    {
        if (!value.is_object() || value.empty())
        {
            return value;
        }
        bool safe = true;
        std::size_t index = 0;
        for (const auto& item : value.object_range())
        {
            std::size_t n;
            auto r = jsoncons::detail::dec_to_integer(item.key().data(),item.key().size(), n);
            if (!r || (index++ != n))
            {
                safe = false;
                break;
            }
        }

        if (safe)
        {
            Json j(json_array_arg);
            j.reserve(value.size());
            for (auto& item : value.object_range())
            {
                j.emplace_back(std::move(item.value()));
            }
            Json a(json_array_arg);
            for (auto& item : j.array_range())
            {
                a.emplace_back(safe_unflatten (item));
            }
            return a;
        }
        else
        {
            Json o(json_object_arg);
            for (auto& item : value.object_range())
            {
                o.try_emplace(item.key(), safe_unflatten (item.value()));
            }
            return o;
        }
    }